

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::MinTypMaxExpressionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,MinTypMaxExpressionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *pSVar1;
  size_t index_local;
  MinTypMaxExpressionSyntax *this_local;
  
  switch(index) {
  case 0:
    pSVar1 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->min)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,pSVar1);
    break;
  case 1:
    token.kind = (this->colon1).kind;
    token._2_1_ = (this->colon1).field_0x2;
    token.numFlags.raw = (this->colon1).numFlags.raw;
    token.rawLen = (this->colon1).rawLen;
    token.info = (this->colon1).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    pSVar1 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->typ)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,pSVar1);
    break;
  case 3:
    token_00.kind = (this->colon2).kind;
    token_00._2_1_ = (this->colon2).field_0x2;
    token_00.numFlags.raw = (this->colon2).numFlags.raw;
    token_00.rawLen = (this->colon2).rawLen;
    token_00.info = (this->colon2).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 4:
    pSVar1 = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->max)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,pSVar1);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax MinTypMaxExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return min.get();
        case 1: return colon1;
        case 2: return typ.get();
        case 3: return colon2;
        case 4: return max.get();
        default: return nullptr;
    }
}